

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O0

void __thiscall QUndoStack::setUndoLimit(QUndoStack *this,int limit)

{
  long lVar1;
  bool bVar2;
  QUndoStackPrivate *pQVar3;
  int in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QUndoStackPrivate *d;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  QUndoStackPrivate *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QUndoStack *)0xa84259);
  bVar2 = QList<QUndoCommand_*>::isEmpty((QList<QUndoCommand_*> *)0xa8426c);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    if (in_ESI != pQVar3->undo_limit) {
      pQVar3->undo_limit = in_ESI;
      QUndoStackPrivate::checkUndoLimit(in_stack_ffffffffffffffd8);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
               (int)((ulong)pQVar3 >> 0x20),in_stack_ffffffffffffffb8);
    QMessageLogger::warning
              (&stack0xffffffffffffffd8,
               "QUndoStack::setUndoLimit(): an undo limit can only be set when the stack is empty");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUndoStack::setUndoLimit(int limit)
{
    Q_D(QUndoStack);

    if (Q_UNLIKELY(!d->command_list.isEmpty())) {
        qWarning("QUndoStack::setUndoLimit(): an undo limit can only be set when the stack is empty");
        return;
    }

    if (limit == d->undo_limit)
        return;
    d->undo_limit = limit;
    d->checkUndoLimit();
}